

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  bool bVar1;
  path p;
  path local_48;
  file_descriptor_source source;
  
  boost::filesystem::path::path(&p,"/my/path");
  bVar1 = boost::filesystem::exists(&p);
  if (!bVar1) {
    boost::filesystem::current_path();
    boost::filesystem::absolute((path *)&source,&p,&local_48);
    std::__cxx11::string::operator=((string *)&p,(string *)&source);
    std::__cxx11::string::~string((string *)&source);
    std::__cxx11::string::~string((string *)&local_48);
    boost::iostreams::file_descriptor::file_descriptor(&source.super_file_descriptor);
    boost::detail::shared_count::~shared_count(&source.super_file_descriptor.pimpl_.pn);
  }
  std::__cxx11::string::~string((string *)&p);
  return (uint)bVar1;
}

Assistant:

int main(int, char**)
{
  if (false)
    return 0;

  fs::path p("/my/path");
  if (fs::exists(p))
    return 1;

  p = fs::absolute(p);

  boost::iostreams::file_descriptor_source source;
  return 0;
}